

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Add_patch64(void *alpha,int g_a,int64_t *alo,int64_t *ahi,void *beta,int g_b,int64_t *blo,
                    int64_t *bhi,int g_c,int64_t *clo,int64_t *chi)

{
  Integer IVar1;
  Integer IVar2;
  long lVar3;
  long lVar4;
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  IVar1 = pnga_ndim((long)g_a);
  IVar2 = pnga_ndim((long)g_b);
  lVar3 = pnga_ndim((long)g_c);
  lVar4 = IVar1;
  if (0 < IVar1) {
    do {
      _ga_alo[lVar4 + -1] = *alo + 1;
      alo = alo + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (0 < IVar1) {
    do {
      _ga_ahi[IVar1 + -1] = *ahi + 1;
      ahi = ahi + 1;
      IVar1 = IVar1 + -1;
    } while (IVar1 != 0);
  }
  lVar4 = IVar2;
  if (0 < IVar2) {
    do {
      _ga_blo[lVar4 + -1] = *blo + 1;
      blo = blo + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (0 < IVar2) {
    do {
      _ga_bhi[IVar2 + -1] = *bhi + 1;
      bhi = bhi + 1;
      IVar2 = IVar2 + -1;
    } while (IVar2 != 0);
  }
  lVar4 = lVar3;
  if (0 < lVar3) {
    do {
      _ga_clo[lVar4 + -1] = *clo + 1;
      clo = clo + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (0 < lVar3) {
    do {
      _ga_chi[lVar3 + -1] = *chi + 1;
      chi = chi + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  pnga_add_patch(alpha,(long)g_a,_ga_alo,_ga_ahi,beta,(long)g_b,_ga_blo,_ga_bhi,(long)g_c,_ga_clo,
                 _ga_chi);
  return;
}

Assistant:

void NGA_Add_patch64(void * alpha, int g_a, int64_t alo[], int64_t ahi[],
                     void * beta,  int g_b, int64_t blo[], int64_t bhi[],
                                   int g_c, int64_t clo[], int64_t chi[])
{
    Integer a=(Integer)g_a;
    Integer andim = wnga_ndim(a);

    Integer b=(Integer)g_b;
    Integer bndim = wnga_ndim(b);

    Integer c=(Integer)g_c;
    Integer cndim = wnga_ndim(c);

    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);

    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);

    wnga_add_patch(alpha, a, _ga_alo, _ga_ahi, beta, b, _ga_blo, _ga_bhi,
                   c, _ga_clo, _ga_chi);
}